

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fthash.c
# Opt level: O1

FT_Hashnode * hash_bucket(FT_Hashkey key,FT_Hash hash)

{
  FT_Hashnode *ppFVar1;
  FT_Bool FVar2;
  FT_ULong FVar3;
  FT_Hashkey *pFVar4;
  FT_Hashnode *ppFVar5;
  FT_Hashkey local_30;
  FT_Hashkey key_local;
  
  ppFVar1 = hash->table;
  local_30 = key;
  FVar3 = (*hash->lookup)(&local_30);
  ppFVar5 = ppFVar1 + FVar3 % (ulong)hash->size;
  pFVar4 = &(*ppFVar5)->key;
  if (pFVar4 != (FT_Hashkey *)0x0) {
    do {
      FVar2 = (*hash->compare)(pFVar4,&local_30);
      if (FVar2 != '\0') {
        return ppFVar5;
      }
      ppFVar5 = ppFVar5 + -1;
      if (ppFVar5 < ppFVar1) {
        ppFVar5 = ppFVar1 + (hash->size - 1);
      }
      pFVar4 = &(*ppFVar5)->key;
    } while (pFVar4 != (FT_Hashkey *)0x0);
  }
  return ppFVar5;
}

Assistant:

static FT_Hashnode*
  hash_bucket( FT_Hashkey  key,
               FT_Hash     hash )
  {
    FT_ULong      res = 0;
    FT_Hashnode*  bp  = hash->table;
    FT_Hashnode*  ndp;


    res = (hash->lookup)( &key );

    ndp = bp + ( res % hash->size );
    while ( *ndp )
    {
      if ( (hash->compare)( &(*ndp)->key, &key ) )
        break;

      ndp--;
      if ( ndp < bp )
        ndp = bp + ( hash->size - 1 );
    }

    return ndp;
  }